

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

Export * kj::_::
         CopyConstructArray_<capnp::_::RpcSystemBase::RpcConnectionState::Export,_capnp::_::RpcSystemBase::RpcConnectionState::Export_*,_true,_false>
         ::apply(Export *pos,Export *start,Export *end)

{
  ClientHook *pCVar1;
  VineInfo *pVVar2;
  Export *pEVar3;
  ExceptionGuard local_28;
  
  local_28.start = pos;
  local_28.pos = pos;
  if (start != end) {
    do {
      pEVar3 = local_28.pos;
      (local_28.pos)->canonical = start->canonical;
      (local_28.pos)->refcount = start->refcount;
      pCVar1 = (start->clientHook).ptr;
      ((local_28.pos)->clientHook).disposer = (start->clientHook).disposer;
      ((local_28.pos)->clientHook).ptr = pCVar1;
      (start->clientHook).ptr = (ClientHook *)0x0;
      Maybe<kj::Promise<void>_>::Maybe(&(local_28.pos)->resolveOp,&start->resolveOp);
      pVVar2 = (start->vineInfo).ptr.ptr;
      (pEVar3->vineInfo).ptr.disposer = (start->vineInfo).ptr.disposer;
      (pEVar3->vineInfo).ptr.ptr = pVVar2;
      (start->vineInfo).ptr.ptr = (VineInfo *)0x0;
      local_28.pos = local_28.pos + 1;
      start = start + 1;
    } while (start != end);
  }
  pEVar3 = local_28.pos;
  local_28.start = local_28.pos;
  ExceptionGuard::~ExceptionGuard(&local_28);
  return pEVar3;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) (void)implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }